

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O1

void release_thread_cache(void *p)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  FreeBlock *pFVar5;
  ulong uVar6;
  int iVar7;
  long *plVar8;
  CentralCache *cc;
  long *in_FS_OFFSET;
  
  lVar3 = *in_FS_OFFSET;
  uVar6 = 0;
  do {
    plVar1 = (long *)(lVar3 + -0x1870 + uVar6 * 0x18);
    plVar4 = (long *)*plVar1;
    if ((plVar4 != (long *)0x0) || (plVar1[1] != 0)) {
      if (plVar4 == (long *)0x0) {
        iVar7 = 1;
        plVar8 = (long *)0x0;
      }
      else {
        iVar7 = 0;
        do {
          plVar8 = plVar4;
          iVar7 = iVar7 + 1;
          plVar4 = (long *)*plVar8;
        } while ((long *)*plVar8 != (long *)0x0);
      }
      cc = centralCache + uVar6;
      LOCK();
      iVar2 = cc->lock;
      cc->lock = 1;
      UNLOCK();
      while (iVar2 != 0) {
        do {
        } while (cc->lock != 0);
        LOCK();
        iVar2 = cc->lock;
        cc->lock = 1;
        UNLOCK();
      }
      if ((FreeBlock *)plVar1[1] != (FreeBlock *)0x0) {
        add_batch_to_central_cache(cc,(uint)uVar6,(FreeBlock *)plVar1[1]);
      }
      pFVar5 = (FreeBlock *)*plVar1;
      if (pFVar5 != (FreeBlock *)0x0) {
        *plVar8 = (long)centralCache[uVar6].freeList;
        centralCache[uVar6].freeList = pFVar5;
        if (iVar7 != ((0xffffU >> ((byte)(uVar6 >> 2) & 0x1f) & 0xff) - (int)plVar1[2]) + 1) {
          __assert_fail("freeListSize == batch_size(sizeClass) + 1 - tc->counter",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                        ,0x44d,"void release_thread_cache(void *)");
        }
        centralCache[uVar6].freeListSize = centralCache[uVar6].freeListSize + iVar7;
      }
      cc->lock = 0;
      *plVar1 = 0;
      plVar1[1] = 0;
      *(undefined4 *)(plVar1 + 2) = 0;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x104);
  return;
}

Assistant:

static void release_thread_cache(void* p)
{
	unsigned int sizeClass = 0; (void)p;
	for (; sizeClass < NUMBER_OF_SIZE_CLASSES; sizeClass++)
	{
		ThreadCache* tc = &threadCache[sizeClass];
		if (tc->freeList || tc->tempList)
		{
			FreeBlock* tail = tc->freeList;
			unsigned int freeListSize = 1;
			CentralCache* cc = &centralCache[sizeClass];

			if (tail)
				while (tail->next)//search for end of list
					tail = tail->next, freeListSize++;

			SPINLOCK_ACQUIRE(&cc->lock);
			if (tc->tempList)
				add_batch_to_central_cache(cc, sizeClass, tc->tempList);
			if (tc->freeList) {//append tc->freeList to cc->freeList
				tail->next = cc->freeList;
				check_block_next(tail);
				cc->freeList = tc->freeList;
				LTALLOC_ASSERT(freeListSize == batch_size(sizeClass) + 1 - tc->counter);
				cc->freeListSize += freeListSize;
			}
			SPINLOCK_RELEASE(&cc->lock);

			tc->freeList = NULL;
			tc->tempList = NULL;
			tc->counter = 0;
		}
	}
}